

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_trinary_func_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          uint32_t op2,char *op)

{
  uint32_t result_id_00;
  uint32_t result_type_00;
  bool bVar1;
  uint32_t id;
  bool local_b9;
  undefined1 local_b8 [48];
  undefined1 local_88 [32];
  undefined1 local_68 [67];
  bool local_25;
  uint32_t local_24;
  uint32_t uStack_20;
  bool forward;
  uint32_t op2_local;
  uint32_t op1_local;
  uint32_t op0_local;
  uint32_t result_id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  local_24 = op2;
  uStack_20 = op1;
  op2_local = op0;
  op1_local = result_id;
  op0_local = result_type;
  _result_id_local = this;
  bVar1 = should_forward(this,op0);
  local_b9 = false;
  if (bVar1) {
    bVar1 = should_forward(this,uStack_20);
    local_b9 = false;
    if (bVar1) {
      local_b9 = should_forward(this,local_24);
    }
  }
  result_type_00 = op0_local;
  result_id_00 = op1_local;
  local_25 = local_b9;
  id = (uint32_t)this;
  to_unpacked_expression_abi_cxx11_((CompilerGLSL *)local_68,id,SUB41(op2_local,0));
  to_unpacked_expression_abi_cxx11_((CompilerGLSL *)local_88,id,SUB41(uStack_20,0));
  to_unpacked_expression_abi_cxx11_((CompilerGLSL *)local_b8,id,SUB41(local_24,0));
  join<char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
            ((spirv_cross *)(local_68 + 0x20),&op,(char (*) [2])0x601bd3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
             (char (*) [3])0x5fe6df,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
             (char (*) [3])0x5fe6df,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
             (char (*) [2])0x5eaa1a);
  emit_op(this,result_type_00,result_id_00,(string *)(local_68 + 0x20),(bool)(local_25 & 1),false);
  ::std::__cxx11::string::~string((string *)(local_68 + 0x20));
  ::std::__cxx11::string::~string((string *)local_b8);
  ::std::__cxx11::string::~string((string *)local_88);
  ::std::__cxx11::string::~string((string *)local_68);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,op1_local,op2_local);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,op1_local,uStack_20);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,op1_local,local_24);
  return;
}

Assistant:

void CompilerGLSL::emit_trinary_func_op(uint32_t result_type, uint32_t result_id, uint32_t op0, uint32_t op1,
                                        uint32_t op2, const char *op)
{
	bool forward = should_forward(op0) && should_forward(op1) && should_forward(op2);
	emit_op(result_type, result_id,
	        join(op, "(", to_unpacked_expression(op0), ", ", to_unpacked_expression(op1), ", ",
	             to_unpacked_expression(op2), ")"),
	        forward);

	inherit_expression_dependencies(result_id, op0);
	inherit_expression_dependencies(result_id, op1);
	inherit_expression_dependencies(result_id, op2);
}